

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

string * __thiscall
pstack::Reader::readString_abi_cxx11_(string *__return_storage_ptr__,Reader *this,Off offset)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char local_31 [8];
  char c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (offset == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(null)","");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    iVar1 = (*this->_vptr_Reader[8])(this);
    if (offset < CONCAT44(extraout_var,iVar1)) {
      do {
        iVar2 = (*this->_vptr_Reader[2])(this,offset,1,local_31);
        if (CONCAT44(extraout_var_00,iVar2) != 1) {
          return __return_storage_ptr__;
        }
        if (local_31[0] == '\0') {
          return __return_storage_ptr__;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,local_31[0]);
        offset = offset + 1;
      } while (CONCAT44(extraout_var,iVar1) != offset);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string
Reader::readString(Off offset) const
{
    if (offset == 0)
        return "(null)";
    string res;
    for (Off s = size(); offset < s; ++offset) {
        char c;
        if (read(offset, 1, &c) != 1)
            break;
        if (c == 0)
            break;
        res += c;
    }
    return res;
}